

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O2

void __thiscall Dashel::ParameterSet::add(ParameterSet *this,char *line)

{
  pointer pbVar1;
  char *pcVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  long lVar5;
  allocator<char> local_69;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  pointer local_60;
  char *local_58;
  key_type local_50;
  
  local_58 = strdup(line);
  local_60 = (this->params).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->params).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar2 = strtok(local_58,":");
  if (pcVar2 != (char *)0x0) {
    local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->params;
    lVar5 = 0;
    while( true ) {
      pcVar2 = strtok((char *)0x0,";");
      if (pcVar2 == (char *)0x0) break;
      pcVar3 = strchr(pcVar2,0x3d);
      if (pcVar3 == (char *)0x0) {
        if (pbVar1 == local_60) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar2,&local_69);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_68,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->values,
                              (key_type *)
                              ((long)&(((this->params).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar5));
        std::__cxx11::string::assign((char *)pmVar4);
      }
      else {
        *pcVar3 = '\0';
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar2,&local_69);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->values,&local_50);
        std::__cxx11::string::assign((char *)pmVar4);
        std::__cxx11::string::~string((string *)&local_50);
        if (pbVar1 == local_60) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar2,&local_69);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_68,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      lVar5 = lVar5 + 0x20;
    }
    free(local_58);
    return;
  }
  __assert_fail("protocolName",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-common.cpp"
                ,0xe8,"void Dashel::ParameterSet::add(const char *)");
}

Assistant:

void ParameterSet::add(const char* line)
	{
		char* lc = strdup(line);
		int spc = 0;
		char* param;
		bool storeParams = (params.size() == 0);
		char* protocolName = strtok(lc, ":");

		// Do nothing with this.
		assert(protocolName);

		while ((param = strtok(NULL, ";")) != NULL)
		{
			char* sep = strchr(param, '=');
			if (sep)
			{
				*sep++ = 0;
				values[param] = sep;
				if (storeParams)
					params.push_back(param);
			}
			else
			{
				if (storeParams)
					params.push_back(param);
				values[params[spc]] = param;
			}
			++spc;
		}

		free(lc);
	}